

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_hexadecimal_integer<std::vector<char,std::allocator<char>>>
          (result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  source_ptr *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  undefined8 uVar3;
  undefined8 uVar4;
  size_type sVar5;
  value_type *pvVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string str;
  integer retval;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  istringstream iss;
  allocator_type local_2c9;
  string local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  undefined8 local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  char *local_250;
  char *pcStack_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  undefined1 local_238 [72];
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  char *local_1b0;
  char *pcStack_1a8;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::character<(char)48>,toml::detail::character<(char)120>>,toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
  ::invoke<std::vector<char,std::allocator<char>>>
            ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)&local_240,
             (sequence<toml::detail::sequence<toml::detail::character<(char)48>,toml::detail::character<(char)120>>,toml::detail::sequence<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>>>,toml::detail::unlimited>>>
              *)this,loc);
  if (local_240._0_1_ == true) {
    pvVar6 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                       *)&local_240);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_2c8,(detail *)(pvVar6->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar6->last_)._M_current,in_RCX);
    local_1a0[0] = 0x5f;
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2c8._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_2c8._M_dataplus._M_p + local_2c8._M_string_length),
                       (_Iter_equals_val<const_char>)local_1a0);
    local_2c8._M_string_length = (size_type)(_Var7._M_current + -(long)local_2c8._M_dataplus._M_p);
    *_Var7._M_current = '\0';
    std::__cxx11::string::_M_erase((ulong)&local_2c8,0);
    std::__cxx11::string::_M_erase((ulong)&local_2c8,0);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1a0,(string *)&local_2c8,_S_in);
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(uint *)((long)local_188 + (long)((region_base *)((long)local_1a0 + -0x18))->_vptr_region_base)
         = *(uint *)((long)local_188 +
                    (long)((region_base *)((long)local_1a0 + -0x18))->_vptr_region_base) &
           0xffffffb5 | 8;
    std::istream::_M_extract<long>((long *)local_1a0);
    pvVar6 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
             ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                       *)&local_240);
    local_1f0._0_8_ =
         local_2a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    region<std::vector<char,_std::allocator<char>_>_>::region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1f0 + 8),pvVar6);
    sVar5 = local_1c8;
    uVar4 = local_1e0._8_8_;
    uVar3 = local_1e0._M_allocated_capacity;
    local_270 = &local_260;
    local_290._0_8_ = local_1f0._0_8_;
    local_290._8_8_ = &PTR__region_0015dac0;
    local_1e0._M_allocated_capacity = 0;
    local_1e0._8_8_ = 0;
    if (local_1d0 == &local_1c0) {
      local_260._8_8_ = local_1c0._8_8_;
      local_1d0 = local_270;
    }
    local_260._M_allocated_capacity._1_7_ = local_1c0._M_allocated_capacity._1_7_;
    local_260._M_local_buf[0] = local_1c0._M_local_buf[0];
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_250 = local_1b0;
    pcStack_248 = pcStack_1a8;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.first = local_1f0._0_8_;
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_0015dac0;
    local_280._8_8_ = 0;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar3;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    local_280._M_allocated_capacity = 0;
    paVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
         (pointer)paVar2;
    if (local_1d0 == local_270) {
      paVar2->_M_allocated_capacity = local_260._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
           local_260._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)local_1d0;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity
           = local_260._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = sVar5;
    local_268 = 0;
    local_260._M_allocated_capacity = (ulong)(uint7)local_1c0._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = local_1b0;
    (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = pcStack_1a8;
    local_1d0 = &local_1c0;
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_290 + 8));
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)(local_1f0 + 8));
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_240._0_1_ == true) {
      region<std::vector<char,_std::allocator<char>_>_>::~region
                ((region<std::vector<char,_std::allocator<char>_>_> *)local_238);
    }
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
    local_1f0._0_8_ = &local_1e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"[error] toml::parse_hexadecimal_integer","");
    local_1a0 = (undefined1  [8])this;
    local_198._M_p = (pointer)local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_198,"the next token is not an integer","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_1a0;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2c8,__l,&local_2c9);
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline((string *)local_290,(string *)local_1f0,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_2c8,&local_2a8);
    local_238._8_8_ = local_280._M_allocated_capacity;
    uVar3 = local_290._8_8_;
    local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_238 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ == &local_280) {
      local_238._16_8_ = local_280._8_8_;
      local_290._0_8_ = local_240;
    }
    local_290._8_8_ = 0;
    local_280._M_allocated_capacity = local_280._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._0_8_ == local_240) {
      (psVar1->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_238._8_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = local_290._0_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_238._8_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)uVar3;
    local_238._0_8_ = (_func_int **)0x0;
    local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
    local_290._0_8_ = &local_280;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._0_8_ != &local_1e0) {
      operator_delete((void *)local_1f0._0_8_,(ulong)(local_1e0._M_allocated_capacity + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<integer, region<Container>>, std::string>
parse_hexadecimal_integer(location<Container>& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_hex_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        str.erase(str.begin()); str.erase(str.begin()); // remove `0x` prefix

        std::istringstream iss(str);
        integer retval(0);
        iss >> std::hex >> retval;
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("[error] toml::parse_hexadecimal_integer",
               {{std::addressof(loc), "the next token is not an integer"}}));
}